

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O1

optional<siginfo_t> * __thiscall
pstack::Procman::CoreProcess::getSignalInfo
          (optional<siginfo_t> *__return_storage_ptr__,CoreProcess *this)

{
  bool bVar1;
  Elf64_Word EVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  optional<siginfo_t> *poVar6;
  byte bVar7;
  undefined1 local_170 [8];
  anon_struct_128_5_975a5653_for__M_value t;
  iterator __end2;
  long local_e0;
  long local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  iterator local_b0 [8];
  iterator __begin2;
  long local_a0;
  long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  NoteDesc local_68;
  Reader *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  optional<siginfo_t> *local_38;
  
  bVar7 = 0;
  local_38 = __return_storage_ptr__;
  pstack::Elf::Notes::begin();
  pstack::Elf::Notes::end();
  do {
    if (((___begin2 == ___end2) && (local_a0 == local_e0)) && (local_98 == local_d8)) {
      bVar1 = true;
      goto LAB_0011dbd7;
    }
    Elf::Notes::iterator::operator*(&local_68,local_b0);
    pstack::Elf::NoteDesc::name_abi_cxx11_();
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,"CORE");
    EVar2 = local_68.note.n_type;
    if (iVar3 == 0) {
      if (local_170 != (undefined1  [8])&t.si_code) {
        operator_delete((void *)local_170,t._8_8_ + 1);
      }
      if (EVar2 == 0x53494749) {
        pstack::Elf::NoteDesc::data();
        Reader::readObj<siginfo_t>
                  (local_48,0,(anon_struct_128_5_975a5653_for__M_value *)local_170,1);
        puVar5 = (undefined8 *)local_170;
        poVar6 = local_38;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(undefined8 *)
           &(poVar6->super__Optional_base<siginfo_t,_true,_true>)._M_payload.
            super__Optional_payload_base<siginfo_t>._M_payload = *puVar5;
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
          poVar6 = (optional<siginfo_t> *)((long)poVar6 + (ulong)bVar7 * -0x10 + 8);
        }
        (local_38->super__Optional_base<siginfo_t,_true,_true>)._M_payload.
        super__Optional_payload_base<siginfo_t>._M_engaged = true;
        if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
        }
        if (local_68.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.io.
                     super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        bVar1 = false;
LAB_0011dbd7:
        if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
        }
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
        if (bVar1) {
          (local_38->super__Optional_base<siginfo_t,_true,_true>)._M_payload.
          super__Optional_payload_base<siginfo_t>._M_engaged = false;
        }
        return local_38;
      }
    }
    else if (local_170 != (undefined1  [8])&t.si_code) {
      operator_delete((void *)local_170,t._8_8_ + 1);
    }
    if (local_68.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pstack::Elf::Notes::iterator::operator++(local_b0);
  } while( true );
}

Assistant:

std::optional<siginfo_t>
CoreProcess::getSignalInfo() const {
   for ( const auto &note : coreImage->notes() ) {
      if ( note.name() == "CORE" && note.type() == NT_SIGINFO ) {
         return note.data()->readObj<siginfo_t>(0);
      }
   }
   return std::nullopt;
}